

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_engine.cpp
# Opt level: O3

adios2_error
adios2_get(adios2_engine *engine,adios2_variable *variable,void *values,adios2_mode mode)

{
  signed *psVar1;
  char *pcVar2;
  uchar *puVar3;
  complex *pcVar4;
  double *pdVar5;
  int *piVar6;
  long *plVar7;
  ulong *puVar8;
  short *psVar9;
  ushort *puVar10;
  string *psVar11;
  uint *puVar12;
  longdouble *plVar13;
  float *pfVar14;
  Mode MVar15;
  string dataStr;
  string local_88;
  string local_68;
  string local_48;
  
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"for adios2_engine, in call to adios2_get","");
  adios2::helper::CheckForNullptr<adios2_engine>(engine,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"for adios2_variable, in call to adios2_get","");
  adios2::helper::CheckForNullptr<adios2_variable>(variable,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  MVar15 = (Mode)values;
  switch(*(undefined4 *)(variable + 0x28)) {
  case 1:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    psVar1 = (signed *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<signed_char>::typeinfo,0);
    adios2::core::Engine::Get<signed_char>((Variable *)engine,psVar1,MVar15);
    break;
  case 2:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    psVar9 = (short *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<short>::typeinfo,0);
    adios2::core::Engine::Get<short>((Variable *)engine,psVar9,MVar15);
    break;
  case 3:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    piVar6 = (int *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                   &adios2::core::Variable<int>::typeinfo,0);
    adios2::core::Engine::Get<int>((Variable *)engine,piVar6,MVar15);
    break;
  case 4:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    plVar7 = (long *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<long>::typeinfo,0);
    adios2::core::Engine::Get<long>((Variable *)engine,plVar7,MVar15);
    break;
  case 5:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    puVar3 = (uchar *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_char>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_char>((Variable *)engine,puVar3,MVar15);
    break;
  case 6:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    puVar10 = (ushort *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<unsigned_short>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_short>((Variable *)engine,puVar10,MVar15);
    break;
  case 7:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    puVar12 = (uint *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_int>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_int>((Variable *)engine,puVar12,MVar15);
    break;
  case 8:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    puVar8 = (ulong *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                     &adios2::core::Variable<unsigned_long>::typeinfo,0);
    adios2::core::Engine::Get<unsigned_long>((Variable *)engine,puVar8,MVar15);
    break;
  case 9:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pfVar14 = (float *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                      &adios2::core::Variable<float>::typeinfo,0);
    adios2::core::Engine::Get<float>((Variable *)engine,pfVar14,MVar15);
    break;
  case 10:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pdVar5 = (double *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<double>::typeinfo,0);
    adios2::core::Engine::Get<double>((Variable *)engine,pdVar5,MVar15);
    break;
  case 0xb:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    plVar13 = (longdouble *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<long_double>::typeinfo,0);
    adios2::core::Engine::Get<long_double>((Variable *)engine,plVar13,MVar15);
    break;
  case 0xc:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pcVar4 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<float>>::typeinfo,0);
    adios2::core::Engine::Get<std::complex<float>>((Variable *)engine,pcVar4,MVar15);
    break;
  case 0xd:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pcVar4 = (complex *)
             __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                            &adios2::core::Variable<std::complex<double>>::typeinfo,0);
    adios2::core::Engine::Get<std::complex<double>>((Variable *)engine,pcVar4,MVar15);
    break;
  case 0xe:
    local_88._M_string_length = 0;
    local_88.field_2._M_local_buf[0] = '\0';
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    psVar11 = (string *)
              __dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                             &adios2::core::Variable<std::__cxx11::string>::typeinfo,0);
    adios2::core::Engine::Get<std::__cxx11::string>((Variable *)engine,psVar11,(Mode)&local_88);
    std::__cxx11::string::copy((char *)&local_88,(ulong)values,local_88._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    break;
  case 0xf:
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,
               "only adios2_mode_deferred or adios2_mode_sync are valid, in call to adios2_get","");
    anon_unknown.dwarf_40467::adios2_ToMode(mode,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    pcVar2 = (char *)__dynamic_cast(variable,&adios2::core::VariableBase::typeinfo,
                                    &adios2::core::Variable<char>::typeinfo,0);
    adios2::core::Engine::Get<char>((Variable *)engine,pcVar2,MVar15);
  }
  return adios2_error_none;
}

Assistant:

adios2_error adios2_get(adios2_engine *engine, adios2_variable *variable, void *values,
                        const adios2_mode mode)
{
    try
    {
        adios2::helper::CheckForNullptr(engine, "for adios2_engine, in call to adios2_get");

        adios2::core::Engine *engineCpp = reinterpret_cast<adios2::core::Engine *>(engine);

        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call "
                                                  "to adios2_get");

        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);

        const adios2::DataType type(variableBase->m_Type);

        if (type == adios2::DataType::Struct)
        {
            // not supported
        }
        else if (type == adios2::helper::GetDataType<std::string>())
        {
            std::string dataStr;
            engineCpp->Get(*dynamic_cast<adios2::core::Variable<std::string> *>(variableBase),
                           dataStr);
            dataStr.copy(reinterpret_cast<char *>(values), dataStr.size());
        }
#define declare_template_instantiation(T)                                                          \
    else if (type == adios2::helper::GetDataType<T>())                                             \
    {                                                                                              \
        const adios2::Mode modeCpp =                                                               \
            adios2_ToMode(mode, "only adios2_mode_deferred or adios2_mode_sync are valid, "        \
                                "in call to adios2_get");                                          \
        engineCpp->Get(*dynamic_cast<adios2::core::Variable<T> *>(variableBase),                   \
                       reinterpret_cast<T *>(values), modeCpp);                                    \
    }
        ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_template_instantiation)
#undef declare_template_instantiation
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_get"));
    }
}